

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_textedit_cut(nk_text_edit *state)

{
  nk_text_edit *state_local;
  
  if (state->mode == '\0') {
    state_local._4_4_ = 0;
  }
  else if (state->select_start == state->select_end) {
    state_local._4_4_ = 0;
  }
  else {
    nk_textedit_delete_selection(state);
    state->has_preferred_x = '\0';
    state_local._4_4_ = 1;
  }
  return state_local._4_4_;
}

Assistant:

NK_API int
nk_textedit_cut(struct nk_text_edit *state)
{
    /* API cut: delete selection */
    if (state->mode == NK_TEXT_EDIT_MODE_VIEW)
        return 0;
    if (NK_TEXT_HAS_SELECTION(state)) {
        nk_textedit_delete_selection(state); /* implicitly clamps */
        state->has_preferred_x = 0;
        return 1;
    }
   return 0;
}